

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O2

bool __thiscall Hpipe::Cond::always_checked(Cond *this,Cond *not_in)

{
  _WordT *p_Var1;
  long lVar2;
  int i;
  ulong uVar3;
  
  if (not_in == (Cond *)0x0) {
    lVar2 = 0;
    do {
      if (lVar2 == 3) {
        return (this->p).super__Base_bitset<4UL>._M_w[3] == 0xffffffffffffffff;
      }
      p_Var1 = (this->p).super__Base_bitset<4UL>._M_w + lVar2;
      lVar2 = lVar2 + 1;
    } while (*p_Var1 == 0xffffffffffffffff);
    return false;
  }
  for (uVar3 = 0; uVar3 != 0x100; uVar3 = uVar3 + 1) {
    if ((((not_in->p).super__Base_bitset<4UL>._M_w[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) == 0) &&
       (((this->p).super__Base_bitset<4UL>._M_w[uVar3 >> 6] & 1L << ((byte)uVar3 & 0x3f)) == 0))
    break;
  }
  return uVar3 == 0x100;
}

Assistant:

bool Cond::always_checked( const Cond *not_in ) const {
    if ( not_in ) {
        for( int i = 0; i < p_size; ++i )
            if ( not not_in->p[ i ] and not p[ i ] )
                return false;
        return true;
    }
    return p.all();
}